

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O2

void ImGui_ImplGlfw_NewFrame(void)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  ImGuiMouseCursor IVar4;
  ImGuiIO *pIVar5;
  float *pfVar6;
  uchar *puVar7;
  GLFWcursor *cursorHandle;
  int i;
  long lVar8;
  ImVec2 IVar9;
  double dVar10;
  ImVec2 IVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  int display_h;
  int display_w;
  double mouse_x;
  int buttons_count;
  int h;
  int w;
  int local_38;
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  int local_1c;
  
  pIVar5 = ImGui::GetIO();
  bVar2 = ImFontAtlas::IsBuilt(pIVar5->Fonts);
  if (!bVar2) {
    __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/Terrain/imgui_impl.cpp"
                  ,0x144,"void ImGui_ImplGlfw_NewFrame()");
  }
  glfwGetWindowSize(g_Window,&local_1c,&local_20);
  glfwGetFramebufferSize(g_Window,&local_34,&local_38);
  IVar9.x = (float)local_1c;
  IVar9.y = (float)local_20;
  auVar14._8_8_ = 0;
  auVar14._0_4_ = IVar9.x;
  auVar14._4_4_ = IVar9.y;
  pIVar5->DisplaySize = IVar9;
  if (0 < local_20 && 0 < local_1c) {
    auVar13._0_4_ = (float)local_34;
    auVar13._4_4_ = (float)local_38;
    auVar13._8_8_ = 0;
    auVar14 = divps(auVar13,auVar14);
    pIVar5->DisplayFramebufferScale = auVar14._0_8_;
  }
  dVar10 = glfwGetTime();
  if (0.0 < g_Time) {
    fVar12 = (float)(dVar10 - g_Time);
  }
  else {
    fVar12 = 0.016666668;
  }
  pIVar5->DeltaTime = fVar12;
  g_Time = dVar10;
  pIVar5 = ImGui::GetIO();
  for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
    bVar2 = true;
    if (g_MouseJustPressed[lVar8] == false) {
      iVar3 = glfwGetMouseButton(g_Window,(int)lVar8);
      bVar2 = iVar3 != 0;
    }
    pIVar5->MouseDown[lVar8] = bVar2;
    g_MouseJustPressed[lVar8] = false;
  }
  fVar12 = (pIVar5->MousePos).x;
  fVar15 = (pIVar5->MousePos).y;
  (pIVar5->MousePos).x = -3.4028235e+38;
  (pIVar5->MousePos).y = -3.4028235e+38;
  iVar3 = glfwGetWindowAttrib(g_Window,0x20001);
  if (iVar3 != 0) {
    if (pIVar5->WantSetMousePos == true) {
      glfwSetCursorPos(g_Window,(double)fVar12,(double)fVar15);
    }
    else {
      glfwGetCursorPos(g_Window,(double *)&local_30,(double *)&local_28);
      IVar11.x = (float)(double)CONCAT44(local_30._4_4_,(int)local_30);
      IVar11.y = (float)(double)CONCAT44(local_28._4_4_,(uint)local_28);
      pIVar5->MousePos = IVar11;
    }
  }
  pIVar5 = ImGui::GetIO();
  if (((pIVar5->ConfigFlags & 0x20) == 0) &&
     (iVar3 = glfwGetInputMode(g_Window,0x33001), iVar3 != 0x34003)) {
    IVar4 = ImGui::GetMouseCursor();
    iVar3 = 0x34002;
    if ((IVar4 != -1) && (pIVar5->MouseDrawCursor == false)) {
      cursorHandle = g_MouseCursors[IVar4];
      if (g_MouseCursors[IVar4] == (GLFWcursor *)0x0) {
        cursorHandle = g_MouseCursors[0];
      }
      glfwSetCursor(g_Window,cursorHandle);
      iVar3 = 0x34001;
    }
    glfwSetInputMode(g_Window,0x33001,iVar3);
  }
  pIVar5 = ImGui::GetIO();
  pIVar5->NavInputs[0] = 0.0;
  pIVar5->NavInputs[1] = 0.0;
  pIVar5->NavInputs[2] = 0.0;
  pIVar5->NavInputs[3] = 0.0;
  pIVar5->NavInputs[4] = 0.0;
  pIVar5->NavInputs[5] = 0.0;
  pIVar5->NavInputs[6] = 0.0;
  pIVar5->NavInputs[7] = 0.0;
  pIVar5->NavInputs[8] = 0.0;
  pIVar5->NavInputs[9] = 0.0;
  pIVar5->NavInputs[10] = 0.0;
  pIVar5->NavInputs[0xb] = 0.0;
  pIVar5->NavInputs[0x14] = 0.0;
  pIVar5->NavInputs[0xc] = 0.0;
  pIVar5->NavInputs[0xd] = 0.0;
  pIVar5->NavInputs[0xe] = 0.0;
  pIVar5->NavInputs[0xf] = 0.0;
  pIVar5->NavInputs[0x10] = 0.0;
  pIVar5->NavInputs[0x11] = 0.0;
  pIVar5->NavInputs[0x12] = 0.0;
  pIVar5->NavInputs[0x13] = 0.0;
  if ((pIVar5->ConfigFlags & 2) == 0) {
    return;
  }
  local_30._0_4_ = 0;
  local_28._0_4_ = 0;
  pfVar6 = glfwGetJoystickAxes(0,(int *)&local_30);
  puVar7 = glfwGetJoystickButtons(0,(int *)&local_28);
  if ((int)(uint)local_28 < 1) goto LAB_0016e242;
  if (*puVar7 == '\x01') {
    pIVar5->NavInputs[0] = 1.0;
  }
  if ((uint)local_28 == 1) goto LAB_0016e242;
  if (puVar7[1] == '\x01') {
    pIVar5->NavInputs[1] = 1.0;
  }
  if ((uint)local_28 < 3) goto LAB_0016e242;
  if (puVar7[2] == '\x01') {
    pIVar5->NavInputs[3] = 1.0;
  }
  if ((uint)local_28 == 3) goto LAB_0016e242;
  if (puVar7[3] == '\x01') {
    pIVar5->NavInputs[2] = 1.0;
  }
  if ((uint)local_28 < 0xe) {
    if (0xb < (uint)local_28) goto LAB_0016e1ab;
    if ((uint)local_28 == 0xb) goto LAB_0016e1c2;
    if ((uint)local_28 < 5) goto LAB_0016e242;
  }
  else {
    if (puVar7[0xd] == '\x01') {
      pIVar5->NavInputs[4] = 1.0;
    }
LAB_0016e1ab:
    if (puVar7[0xb] == '\x01') {
      pIVar5->NavInputs[5] = 1.0;
    }
LAB_0016e1c2:
    if (puVar7[10] == '\x01') {
      pIVar5->NavInputs[6] = 1.0;
    }
    if ((0xc < (uint)local_28) && (puVar7[0xc] == '\x01')) {
      pIVar5->NavInputs[7] = 1.0;
    }
  }
  if (puVar7[4] == '\x01') {
    pIVar5->NavInputs[0xc] = 1.0;
  }
  if ((uint)local_28 < 6) {
    lVar8 = 0x37c;
    uVar1 = puVar7[4];
  }
  else {
    if (puVar7[5] == '\x01') {
      pIVar5->NavInputs[0xd] = 1.0;
    }
    if (puVar7[4] == '\x01') {
      pIVar5->NavInputs[0xe] = 1.0;
    }
    lVar8 = 0x380;
    uVar1 = puVar7[5];
  }
  if (uVar1 == '\x01') {
    *(undefined4 *)((long)pIVar5->KeyMap + lVar8 + -0x34) = 0x3f800000;
  }
LAB_0016e242:
  if ((int)local_30 < 1) {
    fVar12 = 0.0;
  }
  else {
    fVar12 = *pfVar6 + 0.3;
  }
  fVar15 = 1.0;
  if (fVar12 / -0.59999996 <= 1.0) {
    fVar15 = fVar12 / -0.59999996;
  }
  if (pIVar5->NavInputs[8] <= fVar15 && fVar15 != pIVar5->NavInputs[8]) {
    pIVar5->NavInputs[8] = fVar15;
  }
  if ((int)local_30 < 1) {
    fVar12 = 0.0;
  }
  else {
    fVar12 = *pfVar6 + -0.3;
  }
  fVar15 = 1.0;
  if (fVar12 / 0.59999996 <= 1.0) {
    fVar15 = fVar12 / 0.59999996;
  }
  if (pIVar5->NavInputs[9] <= fVar15 && fVar15 != pIVar5->NavInputs[9]) {
    pIVar5->NavInputs[9] = fVar15;
  }
  fVar12 = 0.0;
  if (1 < (int)local_30) {
    fVar12 = pfVar6[1] + -0.3;
  }
  fVar15 = 1.0;
  if (fVar12 / 0.59999996 <= 1.0) {
    fVar15 = fVar12 / 0.59999996;
  }
  if (pIVar5->NavInputs[10] <= fVar15 && fVar15 != pIVar5->NavInputs[10]) {
    pIVar5->NavInputs[10] = fVar15;
  }
  fVar12 = 0.0;
  if (1 < (int)local_30) {
    fVar12 = pfVar6[1] + 0.3;
  }
  fVar15 = 1.0;
  if (fVar12 / -0.59999996 <= 1.0) {
    fVar15 = fVar12 / -0.59999996;
  }
  if (pIVar5->NavInputs[0xb] <= fVar15 && fVar15 != pIVar5->NavInputs[0xb]) {
    pIVar5->NavInputs[0xb] = fVar15;
  }
  pIVar5->BackendFlags =
       (uint)(0 < (int)(uint)local_28 && 0 < (int)local_30) | pIVar5->BackendFlags & 0xfffffffeU;
  return;
}

Assistant:

void ImGui_ImplGlfw_NewFrame()
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step
    double current_time = glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    ImGui_ImplGlfw_UpdateMousePosAndButtons();
    ImGui_ImplGlfw_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplGlfw_UpdateGamepads();
}